

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

void __thiscall
baryonyx::itm::default_cost_type<double>::default_cost_type
          (default_cost_type<double> *this,default_cost_type<double> *other,int n)

{
  double *__s;
  ulong __n;
  
  __n = 0xffffffffffffffff;
  if (-1 < n) {
    __n = (ulong)(uint)n * 8;
  }
  this->obj = other->obj;
  __s = (double *)operator_new__(__n);
  memset(__s,0,__n);
  (this->linear_elements)._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl = __s;
  if (0 < n) {
    memmove(__s,(other->linear_elements)._M_t.
                super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                super__Head_base<0UL,_double_*,_false>._M_head_impl,(ulong)(uint)n << 3);
    return;
  }
  return;
}

Assistant:

default_cost_type(const default_cost_type& other, int n)
      : obj(other.obj)
      , linear_elements(std::make_unique<Float[]>(n))
    {
        std::copy_n(other.linear_elements.get(), n, linear_elements.get());
    }